

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

DWARFDie __thiscall llvm::DWARFUnit::getSibling(DWARFUnit *this,DWARFDebugInfoEntry *Die)

{
  uint32_t uVar1;
  uint32_t uVar2;
  DWARFAbbreviationDeclaration *pDVar3;
  size_type sVar4;
  reference pvVar5;
  size_t EndIdx;
  size_t I;
  uint32_t Depth;
  DWARFDebugInfoEntry *Die_local;
  DWARFUnit *this_local;
  
  if (Die == (DWARFDebugInfoEntry *)0x0) {
    memset(&this_local,0,0x10);
    DWARFDie::DWARFDie((DWARFDie *)&this_local);
  }
  else {
    uVar1 = DWARFDebugInfoEntry::getDepth(Die);
    if (uVar1 == 0) {
      memset(&this_local,0,0x10);
      DWARFDie::DWARFDie((DWARFDie *)&this_local);
    }
    else {
      pDVar3 = DWARFDebugInfoEntry::getAbbreviationDeclarationPtr(Die);
      if (pDVar3 == (DWARFAbbreviationDeclaration *)0x0) {
        memset(&this_local,0,0x10);
        DWARFDie::DWARFDie((DWARFDie *)&this_local);
      }
      else {
        uVar2 = getDIEIndex(this,Die);
        sVar4 = std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::
                size(&this->DieArray);
        for (EndIdx = (size_t)(uVar2 + 1); EndIdx < sVar4; EndIdx = EndIdx + 1) {
          pvVar5 = std::
                   vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::
                   operator[](&this->DieArray,EndIdx);
          uVar2 = DWARFDebugInfoEntry::getDepth(pvVar5);
          if (uVar2 == uVar1) {
            pvVar5 = std::
                     vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::
                     operator[](&this->DieArray,EndIdx);
            DWARFDie::DWARFDie((DWARFDie *)&this_local,this,pvVar5);
            return _this_local;
          }
        }
        memset(&this_local,0,0x10);
        DWARFDie::DWARFDie((DWARFDie *)&this_local);
      }
    }
  }
  return _this_local;
}

Assistant:

DWARFDie DWARFUnit::getSibling(const DWARFDebugInfoEntry *Die) {
  if (!Die)
    return DWARFDie();
  uint32_t Depth = Die->getDepth();
  // Unit DIEs always have a depth of zero and never have siblings.
  if (Depth == 0)
    return DWARFDie();
  // NULL DIEs don't have siblings.
  if (Die->getAbbreviationDeclarationPtr() == nullptr)
    return DWARFDie();

  // Find the next DIE whose depth is the same as the Die's depth.
  for (size_t I = getDIEIndex(Die) + 1, EndIdx = DieArray.size(); I < EndIdx;
       ++I) {
    if (DieArray[I].getDepth() == Depth)
      return DWARFDie(this, &DieArray[I]);
  }
  return DWARFDie();
}